

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * __thiscall
el::base::TypedConfigurations::resolveFilename
          (string *__return_storage_ptr__,TypedConfigurations *this,string *filename)

{
  char cVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  undefined1 *puVar4;
  ulong uVar5;
  size_type sVar6;
  SubsecondPrecision *in_R9;
  char *pcVar7;
  long lVar8;
  timeval tval;
  string dateTimeFormatSpecifierStr;
  string fmt;
  timeval currTime;
  SubsecondPrecision ssPrec;
  string now;
  string local_220;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  timeval local_1e0;
  long local_1d0 [2];
  char local_1c0 [8];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + filename->_M_string_length);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"%datetime","");
  _Var3._M_p = local_220._M_dataplus._M_p;
  strlen(local_220._M_dataplus._M_p);
  uVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,(ulong)_Var3._M_p,0);
  if (uVar5 != 0xffffffffffffffff) {
    if (uVar5 != 0) {
      do {
        _Var3._M_p = local_220._M_dataplus._M_p;
        if ((__return_storage_ptr__->_M_dataplus)._M_p[uVar5 - 1] != '%') {
          if (uVar5 == 0xffffffffffffffff) goto LAB_0013bd34;
          goto LAB_0013bb3b;
        }
        strlen(local_220._M_dataplus._M_p);
        uVar5 = std::__cxx11::string::find
                          ((char *)__return_storage_ptr__,(ulong)_Var3._M_p,uVar5 + 1);
      } while (uVar5 != 0);
      uVar5 = 0;
    }
LAB_0013bb3b:
    pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p + local_220._M_string_length + uVar5;
    local_200 = &local_1f0;
    local_1f8 = 0;
    local_1f0 = 0;
    if ((uVar5 < __return_storage_ptr__->_M_string_length) && (*pcVar7 == '{')) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      for (lVar8 = 1; (cVar1 = pcVar7[lVar8], cVar1 != '\0' && (cVar1 != '}')); lVar8 = lVar8 + 1) {
        local_1e0.tv_sec._0_1_ = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_1e0,1);
      }
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar5 + local_220._M_string_length);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&local_200,(string *)&local_1e0);
      if ((long *)CONCAT71(local_1e0.tv_sec._1_7_,(char)local_1e0.tv_sec) != local_1d0) {
        operator_delete((long *)CONCAT71(local_1e0.tv_sec._1_7_,(char)local_1e0.tv_sec),
                        local_1d0[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"%Y-%M-%d_%H-%m","");
      std::__cxx11::string::operator=((string *)&local_200,(string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
    puVar4 = local_200;
    local_1c0[0] = '\x03';
    local_1c0[1] = '\0';
    local_1c0[2] = '\0';
    local_1c0[3] = '\0';
    local_1c0[4] = -0x18;
    local_1c0[5] = '\x03';
    local_1c0[6] = '\0';
    local_1c0[7] = '\0';
    gettimeofday(&local_1e0,(__timezone_ptr_t)0x0);
    tval.tv_usec = (__suseconds_t)puVar4;
    tval.tv_sec = local_1e0.tv_usec;
    utils::DateTime::timevalToString_abi_cxx11_
              ((string *)local_1b8,
               (DateTime *)CONCAT71(local_1e0.tv_sec._1_7_,(char)local_1e0.tv_sec),tval,local_1c0,
               in_R9);
    if (local_1b8._8_8_ != 0) {
      sVar6 = 0;
      do {
        if (*(char *)(local_1b8._0_8_ + sVar6) == '/') {
          *(char *)(local_1b8._0_8_ + sVar6) = '-';
        }
        sVar6 = sVar6 + 1;
      } while (local_1b8._8_8_ != sVar6);
    }
    utils::Str::replaceAll(__return_storage_ptr__,&local_220,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
    }
  }
LAB_0013bd34:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypedConfigurations::resolveFilename(const std::string& filename) {
  std::string resultingFilename = filename;
  std::size_t dateIndex = std::string::npos;
  std::string dateTimeFormatSpecifierStr = std::string(base::consts::kDateTimeFormatSpecifierForFilename);
  if ((dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str())) != std::string::npos) {
    while (dateIndex > 0 && resultingFilename[dateIndex - 1] == base::consts::kFormatSpecifierChar) {
      dateIndex = resultingFilename.find(dateTimeFormatSpecifierStr.c_str(), dateIndex + 1);
    }
    if (dateIndex != std::string::npos) {
      const char* ptr = resultingFilename.c_str() + dateIndex;
      // Goto end of specifier
      ptr += dateTimeFormatSpecifierStr.size();
      std::string fmt;
      if ((resultingFilename.size() > dateIndex) && (ptr[0] == '{')) {
        // User has provided format for date/time
        ++ptr;
        int count = 1;  // Start by 1 in order to remove starting brace
        std::stringstream ss;
        for (; *ptr; ++ptr, ++count) {
          if (*ptr == '}') {
            ++count;  // In order to remove ending brace
            break;
          }
          ss << *ptr;
        }
        resultingFilename.erase(dateIndex + dateTimeFormatSpecifierStr.size(), count);
        fmt = ss.str();
      } else {
        fmt = std::string(base::consts::kDefaultDateTimeFormatInFilename);
      }
      base::SubsecondPrecision ssPrec(3);
      std::string now = base::utils::DateTime::getDateTime(fmt.c_str(), &ssPrec);
      base::utils::Str::replaceAll(now, '/', '-'); // Replace path element since we are dealing with filename
      base::utils::Str::replaceAll(resultingFilename, dateTimeFormatSpecifierStr, now);
    }
  }
  return resultingFilename;
}